

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.h
# Opt level: O2

TRef __thiscall slang::CVIterator<false>::dereference(CVIterator<false> *this)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:232:13),_const_std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>_&>
  pCVar1;
  anon_class_1_0_00000001 local_1;
  
  pCVar1 = std::
           visit<slang::CVIterator<false>::dereference()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>const&>
                     (&local_1,&this->current);
  return pCVar1;
}

Assistant:

TRef dereference() const {
        return std::visit(
            [](auto&& arg) -> TRef {
                if constexpr (requires { arg->second; })
                    return arg->second;
                else
                    return *arg;
            },
            current);
    }